

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O0

void __thiscall mp::BasicSolver::Print(BasicSolver *this,CStringRef format,ArgList *args)

{
  char *s;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  allocator<char> *alloc;
  BasicCStringRef<char> in_stack_fffffffffffffd80;
  allocator<char> local_241;
  BasicWriter<char> local_240 [34];
  undefined8 *local_18;
  int local_8;
  
  alloc = &local_241;
  local_18 = in_RDX;
  local_8 = in_ESI;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffffd80.data_,alloc
            );
  std::allocator<char>::~allocator(&local_241);
  fmt::BasicWriter<char>::write(local_240,local_8,(void *)*local_18,local_18[1]);
  this_00 = *(BasicMemoryWriter<char,_std::allocator<char>_> **)(in_RDI + 0x250);
  s = fmt::BasicWriter<char>::c_str(&this_00->super_BasicWriter<char>);
  fmt::BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)&stack0xfffffffffffffd80,s);
  (*(this_00->super_BasicWriter<char>)._vptr_BasicWriter[2])
            (this_00,in_stack_fffffffffffffd80.data_);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  return;
}

Assistant:

void Print(fmt::CStringRef format, const fmt::ArgList &args) {
    fmt::MemoryWriter w;
    w.write(format, args);
    output_handler_->HandleOutput(w.c_str());
  }